

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expr.h
# Opt level: O0

void __thiscall enact::ReferenceExpr::~ReferenceExpr(ReferenceExpr *this)

{
  ReferenceExpr *this_local;
  
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__ReferenceExpr_0016a648;
  std::optional<enact::Token>::~optional(&this->region);
  std::optional<enact::Token>::~optional(&this->permission);
  Token::~Token(&this->oper);
  std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::~unique_ptr(&this->expr);
  Expr::~Expr(&this->super_Expr);
  return;
}

Assistant:

~ReferenceExpr() override = default;